

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  _Bool _Var1;
  CURLcode CVar2;
  char *pcVar3;
  dynbuf req;
  dynbuf local_48;
  
  conn = data->conn;
  Curl_conncontrol(conn,0);
  CVar2 = Curl_proxy_connect(data,0);
  if (CVar2 == CURLE_OK) {
    if (((conn->bits).field_0x4 & 0x10) != 0) {
      return CURLE_OK;
    }
    if (((conn->http_proxy).proxytype == '\x02') && ((conn->bits).proxy_ssl_connected[0] != true)) {
      return CURLE_OK;
    }
    _Var1 = Curl_connect_ongoing(conn);
    if (_Var1) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8e7 & 0x40) != 0) {
      Curl_dyn_init(&local_48,0x800);
      pcVar3 = "TCP6";
      if ((*(uint *)&(data->conn->bits).field_0x4 >> 0xc & 1) == 0) {
        pcVar3 = "TCP4";
      }
      CVar2 = Curl_dyn_addf(&local_48,"PROXY %s %s %s %i %i\r\n",pcVar3,(data->info).conn_local_ip,
                            (data->info).conn_primary_ip,(ulong)(uint)(data->info).conn_local_port,
                            (data->info).conn_primary_port);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      CVar2 = Curl_buffer_send(&local_48,data,&(data->info).request_size,0,0);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    if ((conn->given->flags & 1) == 0) {
      *done = true;
      return CURLE_OK;
    }
    CVar2 = https_connecting(data,done);
    if (CVar2 == CURLE_OK) {
      return CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

#ifndef CURL_DISABLE_PROXY
  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(data, FIRSTSOCKET);
  if(result)
    return result;

  if(conn->bits.proxy_connect_closed)
    /* this is not an error, just part of the connection negotiation */
    return CURLE_OK;

  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return CURLE_OK; /* wait for HTTPS proxy SSL initialization to complete */

  if(Curl_connect_ongoing(conn))
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

  if(data->set.haproxyprotocol) {
    /* add HAProxy PROXY protocol header */
    result = add_haproxy_protocol_header(data);
    if(result)
      return result;
  }
#endif

  if(conn->given->flags & PROTOPT_SSL) {
    /* perform SSL initialization */
    result = https_connecting(data, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}